

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss.cc
# Opt level: O3

void __thiscall
xLearn::CrossEntropyLoss::CalcGrad(CrossEntropyLoss *this,DMatrix *matrix,Model *model)

{
  index_t *piVar1;
  ThreadPool *pTVar2;
  ulong uVar3;
  ostream *poVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  size_type __n;
  int iVar10;
  real_t rVar11;
  vector<float,_std::allocator<float>_> sum;
  Logger local_b8;
  int local_b4;
  undefined1 local_b0 [32];
  undefined1 local_90 [8];
  uint local_88;
  int local_84;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  Score *local_70;
  Model *local_68;
  DMatrix *local_60;
  ulong local_58;
  DMatrix *local_50;
  Model *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_48 = model;
  if (matrix == (DMatrix *)0x0) {
    local_90 = (undefined1  [8])&local_80;
    local_b8.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/cross_entropy_loss.cc"
               ,"");
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"CalcGrad","");
    poVar4 = Logger::Start(ERR,(string *)local_90,0x77,(string *)local_b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/cross_entropy_loss.cc"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x77);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"matrix",6);
    std::operator<<(poVar4," == NULL \n");
  }
  else {
    uVar6 = (ulong)matrix->row_length;
    if (uVar6 != 0) {
      piVar1 = &(this->super_Loss).total_example_;
      *piVar1 = *piVar1 + matrix->row_length;
      iVar8 = 1;
      if ((this->super_Loss).lock_free_ != false) {
        iVar8 = (int)(this->super_Loss).threadNumber_;
      }
      __n = (size_type)iVar8;
      local_90 = (undefined1  [8])((ulong)local_90 & 0xffffffff00000000);
      local_50 = matrix;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_b0,__n,
                 (value_type_conflict1 *)local_90,(allocator_type *)&local_b8);
      local_b4 = iVar8;
      if (0 < iVar8) {
        uVar3 = uVar6 / __n;
        local_58 = uVar6 % __n;
        lVar9 = __n << 2;
        lVar7 = 0;
        iVar8 = 0;
        do {
          __n = __n - 1;
          iVar10 = (int)uVar3;
          local_84 = iVar8 * iVar10;
          uVar5 = iVar10 * (iVar8 + 1);
          local_90 = (undefined1  [8])ce_gradient_thread;
          local_88 = (int)local_58 + uVar5;
          if (__n != 0) {
            local_88 = uVar5;
          }
          local_80._M_allocated_capacity = local_b0._0_8_ + lVar7;
          local_80._M_local_buf[8] = (this->super_Loss).norm_;
          local_70 = (this->super_Loss).score_func_;
          local_68 = local_48;
          local_60 = local_50;
          ThreadPool::
          enqueue<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int))(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_long,unsigned_long)>>
                    ((ThreadPool *)&stack0xffffffffffffffc0,
                     (_Bind<void_(*(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_int,_unsigned_int))(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_long,_unsigned_long)>
                      *)(this->super_Loss).pool_);
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          lVar7 = lVar7 + 4;
          iVar8 = iVar8 + 1;
        } while (lVar9 != lVar7);
      }
      pTVar2 = (this->super_Loss).pool_;
      local_90 = (undefined1  [8])&pTVar2->sync_mutex;
      local_88 = local_88 & 0xffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_90);
      iVar8 = local_b4;
      local_88 = CONCAT31(local_88._1_3_,true);
      if ((pTVar2->sync).super___atomic_base<int>._M_i != local_b4) {
        do {
          std::condition_variable::wait((unique_lock *)&pTVar2->sync_condition);
        } while ((pTVar2->sync).super___atomic_base<int>._M_i != iVar8);
      }
      LOCK();
      (pTVar2->sync).super___atomic_base<int>._M_i = 0;
      UNLOCK();
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_90);
      if (local_b0._8_8_ - local_b0._0_8_ == 0) {
        if ((pointer)local_b0._0_8_ == (pointer)0x0) {
          return;
        }
      }
      else {
        rVar11 = (this->super_Loss).loss_sum_;
        lVar7 = (long)(local_b0._8_8_ - local_b0._0_8_) >> 2;
        lVar9 = 0;
        do {
          rVar11 = rVar11 + *(float *)(local_b0._0_8_ + lVar9 * 4);
          lVar9 = lVar9 + 1;
          (this->super_Loss).loss_sum_ = rVar11;
        } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
      }
      operator_delete((void *)local_b0._0_8_);
      return;
    }
    local_90 = (undefined1  [8])&local_80;
    local_b8.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/cross_entropy_loss.cc"
               ,"");
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"CalcGrad","");
    poVar4 = Logger::Start(ERR,(string *)local_90,0x78,(string *)local_b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK_GT failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/cross_entropy_loss.cc"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"matrix->row_length",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
    std::operator<<(poVar4,"\n");
  }
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_90);
  Logger::~Logger(&local_b8);
  abort();
}

Assistant:

void CrossEntropyLoss::CalcGrad(const DMatrix* matrix,
                                Model& model) {
  CHECK_NOTNULL(matrix);
  CHECK_GT(matrix->row_length, 0);
  size_t row_len = matrix->row_length;
  total_example_ += row_len;
  // multi-thread training
  int count = lock_free_ ? threadNumber_ : 1;
  std::vector<real_t> sum(count, 0);
  for (int i = 0; i < count; ++i) {
    index_t start_idx = getStart(row_len, count, i);
    index_t end_idx = getEnd(row_len, count, i);
    pool_->enqueue(std::bind(ce_gradient_thread,
                             matrix,
                             &model,
                             score_func_,
                             norm_,
                             &(sum[i]),
                             start_idx,
                             end_idx));
  }
  // Wait all of the threads finish their job
  pool_->Sync(count);
  // Accumulate loss
  for (int i = 0; i < sum.size(); ++i) {
    loss_sum_ += sum[i];
  }
}